

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_mask_util.cc
# Opt level: O2

void __thiscall
google::protobuf::util::FieldMaskUtil::MergeMessageTo
          (FieldMaskUtil *this,Message *source,FieldMask *mask,MergeOptions *options,
          Message *destination)

{
  long lVar1;
  long lVar2;
  LogMessage *other;
  undefined1 local_70 [8];
  FieldMaskTree tree;
  LogFinisher local_31;
  
  lVar1 = (**(code **)(*(long *)this + 0x98))();
  lVar2 = (**(code **)(*(long *)options + 0x98))(options);
  if (lVar1 != lVar2) {
    protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_70,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/util/field_mask_util.cc"
               ,0x2b0);
    other = protobuf::internal::LogMessage::operator<<
                      ((LogMessage *)local_70,
                       "CHECK failed: source.GetDescriptor() == destination->GetDescriptor(): ");
    protobuf::internal::LogFinisher::operator=(&local_31,other);
    protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_70);
  }
  tree.root_.children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&tree;
  tree.root_.children._M_t._M_impl._0_4_ = 0;
  tree.root_.children._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  tree.root_.children._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  tree.root_.children._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  tree.root_.children._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       tree.root_.children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  anon_unknown_0::FieldMaskTree::MergeFromFieldMask((FieldMaskTree *)local_70,(FieldMask *)source);
  if (tree.root_.children._M_t._M_impl.super__Rb_tree_header._M_header._M_right != (_Base_ptr)0x0) {
    anon_unknown_0::FieldMaskTree::MergeMessage
              ((FieldMaskTree *)local_70,(Node *)this,&mask->super_Message,options,destination);
  }
  anon_unknown_0::FieldMaskTree::Node::~Node((Node *)local_70);
  return;
}

Assistant:

void FieldMaskUtil::MergeMessageTo(const Message& source, const FieldMask& mask,
                                   const MergeOptions& options,
                                   Message* destination) {
  GOOGLE_CHECK(source.GetDescriptor() == destination->GetDescriptor());
  // Build a FieldMaskTree and walk through the tree to merge all specified
  // fields.
  FieldMaskTree tree;
  tree.MergeFromFieldMask(mask);
  tree.MergeMessage(source, options, destination);
}